

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void basic_example(void)

{
  shared_ptr<spdlog::logger> my_logger;
  allocator local_5a;
  allocator local_59;
  string local_58 [32];
  filename_t local_38;
  
  std::__cxx11::string::string((string *)&local_38,"file_logger",&local_59);
  std::__cxx11::string::string(local_58,"logs/basic-log.txt",&local_5a);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            ((string *)&stack0xffffffffffffffe8,&local_38,SUB81(local_58,0));
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

void basic_example()
{
    // Create basic file logger (not rotated).
    auto my_logger = spdlog::basic_logger_mt("file_logger", "logs/basic-log.txt");
}